

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyTests::createInstance
          (FilteringAnisotropyTests *this,Context *context)

{
  WrapMode *pWVar1;
  undefined8 uVar2;
  SamplerType SVar3;
  TestInstance *pTVar4;
  TextureFormat format;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar5;
  Sampler *pSVar6;
  WrapMode *pWVar7;
  byte bVar8;
  float fVar9;
  undefined1 local_350 [52];
  Context *local_31c;
  float local_118;
  
  bVar8 = 0;
  pTVar4 = (TestInstance *)operator_new(0xb8);
  pTVar4->m_context = context;
  pTVar4->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d68220;
  *(deUint32 *)&pTVar4[1].m_context =
       (this->m_refParams).super_ReferenceParams.super_RenderParams.flags;
  pTVar4[1]._vptr_TestInstance =
       *(_func_int ***)&(this->m_refParams).super_ReferenceParams.super_RenderParams;
  uVar2 = *(undefined8 *)((this->m_refParams).super_ReferenceParams.super_RenderParams.w.m_data + 2)
  ;
  *(undefined8 *)((long)&pTVar4[1].m_context + 4) =
       *(undefined8 *)(this->m_refParams).super_ReferenceParams.super_RenderParams.w.m_data;
  *(undefined8 *)((long)&pTVar4[2]._vptr_TestInstance + 4) = uVar2;
  *(undefined8 *)((long)&pTVar4[2].m_context + 4) =
       *(undefined8 *)&(this->m_refParams).super_ReferenceParams.super_RenderParams.bias;
  uVar2 = *(undefined8 *)
           ((this->m_refParams).super_ReferenceParams.super_RenderParams.colorScale.m_data + 2);
  *(undefined8 *)((long)&pTVar4[3]._vptr_TestInstance + 4) =
       *(undefined8 *)(this->m_refParams).super_ReferenceParams.super_RenderParams.colorScale.m_data
  ;
  *(undefined8 *)((long)&pTVar4[3].m_context + 4) = uVar2;
  uVar2 = *(undefined8 *)
           ((this->m_refParams).super_ReferenceParams.super_RenderParams.colorBias.m_data + 2);
  *(undefined8 *)((long)&pTVar4[4]._vptr_TestInstance + 4) =
       *(undefined8 *)(this->m_refParams).super_ReferenceParams.super_RenderParams.colorBias.m_data;
  *(undefined8 *)((long)&pTVar4[4].m_context + 4) = uVar2;
  pWVar1 = (WrapMode *)((long)&pTVar4[5]._vptr_TestInstance + 4);
  pSVar6 = &(this->m_refParams).super_ReferenceParams.sampler;
  pWVar7 = pWVar1;
  for (lVar5 = 0x14; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pWVar7 = pSVar6->wrapS;
    pSVar6 = (Sampler *)((long)pSVar6 + (ulong)bVar8 * -8 + 4);
    pWVar7 = pWVar7 + (ulong)bVar8 * -2 + 1;
  }
  uVar2 = *(undefined8 *)&(this->m_refParams).maxAnisotropy;
  *(undefined8 *)((long)&pTVar4[10].m_context + 1) =
       *(undefined8 *)((long)&(this->m_refParams).minFilter + 1);
  *(undefined8 *)((long)&pTVar4[10]._vptr_TestInstance + 4) = uVar2;
  util::createSampler((Sampler *)local_350,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      *(FilterMode *)&pTVar4[10].m_context,
                      *(FilterMode *)((long)&pTVar4[10].m_context + 4));
  *(undefined4 *)((long)&pTVar4[7]._vptr_TestInstance + 4) = local_350._32_4_;
  *(undefined8 *)((long)&pTVar4[6]._vptr_TestInstance + 4) = local_350._16_8_;
  *(undefined8 *)((long)&pTVar4[6].m_context + 4) = local_350._24_8_;
  *(undefined8 *)pWVar1 = local_350._0_8_;
  *(undefined8 *)((long)&pTVar4[5].m_context + 4) = local_350._8_8_;
  *(undefined4 *)&pTVar4[7].m_context = local_350._36_4_;
  *(undefined4 *)((long)&pTVar4[7].m_context + 4) = local_350._40_4_;
  *(undefined4 *)&pTVar4[8]._vptr_TestInstance = local_350._44_4_;
  *(undefined4 *)((long)&pTVar4[8]._vptr_TestInstance + 4) = local_350._48_4_;
  pTVar4[8].m_context = local_31c;
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  SVar3 = glu::TextureTestUtil::getSamplerType(format);
  *(SamplerType *)((long)&pTVar4[1]._vptr_TestInstance + 4) = SVar3;
  *(undefined4 *)&pTVar4[1].m_context = 0;
  *(undefined4 *)&pTVar4[9]._vptr_TestInstance = 0;
  vk = Context::getInstanceInterface(pTVar4->m_context);
  physicalDevice = Context::getPhysicalDevice(pTVar4->m_context);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_350,vk,physicalDevice);
  fVar9 = *(float *)((long)&pTVar4[10]._vptr_TestInstance + 4);
  if (local_118 <= fVar9) {
    fVar9 = local_118;
  }
  *(float *)((long)&pTVar4[10]._vptr_TestInstance + 4) = fVar9;
  if (*(char *)&pTVar4[0xb]._vptr_TestInstance == '\x01') {
    *(undefined4 *)&pTVar4[10]._vptr_TestInstance = 7;
    *(undefined8 *)((long)&pTVar4[9]._vptr_TestInstance + 4) = 0x40e0000000000000;
  }
  else {
    *(undefined4 *)&pTVar4[10]._vptr_TestInstance = 0;
  }
  return pTVar4;
}

Assistant:

TestInstance*	createInstance				(Context&	context) const
	{
		return new FilteringAnisotropyInstance(context, m_refParams);
	}